

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTestCase.cpp
# Opt level: O0

void __thiscall
SuiteParserTests::readFixMessageFixture::readFixMessageFixture(readFixMessageFixture *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  readFixMessageFixture *local_10;
  readFixMessageFixture *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->fixMsg2);
  std::__cxx11::string::string((string *)&this->fixMsg3);
  std::__cxx11::string::string((string *)&this->badLength);
  FIX::Parser::Parser(&this->object);
  std::__cxx11::string::operator=((string *)this,"8=FIX.4.2\x019=12\x0135=A\x01108=30\x0110=31\x01")
  ;
  std::__cxx11::string::operator=
            ((string *)&this->fixMsg2,"8=FIX.4.2\x019=17\x0135=4\x0136=88\x01123=Y\x0110=34\x01");
  std::__cxx11::string::operator=
            ((string *)&this->fixMsg3,"8=FIX.4.2\x019=19\x0135=A\x01108=30\x019710=8\x0110=31\x01");
  std::__cxx11::string::operator=
            ((string *)&this->badLength,"8=FIX.4.2\x019=200A\x0135=A\x01108=30\x0110=31\x01");
  std::operator+(&local_80,&this->fixMsg1,&this->fixMsg2);
  std::operator+(&local_60,&local_80,&this->fixMsg3);
  std::operator+(&local_40,&local_60,&this->badLength);
  FIX::Parser::addToStream(&this->object,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

readFixMessageFixture()
  {
    fixMsg1   = "8=FIX.4.2\0019=12\00135=A\001108=30\00110=31\001";
    fixMsg2   = "8=FIX.4.2\0019=17\00135=4\00136=88\001123=Y\00110=34\001";
    fixMsg3   = "8=FIX.4.2\0019=19\00135=A\001108=30\0019710=8\00110=31\001";

    badLength = "8=FIX.4.2\0019=200A\00135=A\001108=30\00110=31\001";


    object.addToStream( fixMsg1 + fixMsg2 + fixMsg3 + badLength );
  }